

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O0

void trim_contents(obj *container,int prob1,int prob2)

{
  obj *poVar1;
  int iVar2;
  obj *onext;
  obj *otmp;
  int prob2_local;
  int prob1_local;
  obj *container_local;
  
  poVar1 = container;
  while (onext = poVar1, onext != (obj *)0x0) {
    poVar1 = onext->nobj;
    if (onext->cobj != (obj *)0x0) {
      trim_contents(onext->cobj,prob1,prob2);
    }
    iVar2 = rnf(prob1,prob2);
    if ((iVar2 != 0) &&
       ((onext != uskin ||
        (((uskin->otyp < 0x5f || (0x69 < uskin->otyp)) &&
         ((uskin->otyp < 0x54 || (0x5e < uskin->otyp)))))))) {
      obj_extract_self(onext);
      obfree(onext,(obj *)0x0);
    }
  }
  return;
}

Assistant:

static void trim_contents(struct obj *container, int prob1, int prob2)
{
	struct obj *otmp;
	struct obj *onext;

	for (otmp = container; otmp; otmp = onext) {
		onext = otmp->nobj;
		if (Has_contents(otmp))
			trim_contents(otmp->cobj, prob1, prob2);
		/* Don't remove dragon scales/mails when player is polymorphed into
		 * that dragon, otherwise if gold dragon armor gets removed, the
		 * associated light source won't be deleted and the game will crash. */
		if (rnf(prob1, prob2) &&
		    !(otmp == uskin && Is_dragon_armor(uskin->otyp))) {
			obj_extract_self(otmp);
			obfree(otmp, NULL);	/* dealloc_obj() isn't sufficient */
		}
	}
}